

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * __thiscall
RPCArg::ToDescriptionString_abi_cxx11_
          (string *__return_storage_ptr__,RPCArg *this,bool is_named_arg)

{
  Fallback *__v;
  __index_type _Var1;
  const_reference __str;
  variant_alternative_t<1UL,_variant<Optional,_basic_string<char,_char_traits<char>,_allocator<char>_>,_UniValue>_>
  *__rhs;
  variant_alternative_t<2UL,_variant<Optional,_basic_string<char,_char_traits<char>,_allocator<char>_>,_UniValue>_>
  *pvVar2;
  variant_alternative_t<0UL,_variant<Optional,_basic_string<char,_char_traits<char>,_allocator<char>_>,_UniValue>_>
  *pvVar3;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  pointer local_28;
  
  this_00 = &bStack_68;
  local_28 = *(pointer *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"(");
  if ((this->m_opts).type_str.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->m_opts).type_str.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if ((ulong)this->m_type < 10) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,
                 &DAT_007303d8 + *(int *)(&DAT_007303d8 + (ulong)this->m_type * 4));
    }
  }
  else {
    __str = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at(&(this->m_opts).type_str,1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,__str);
  }
  __v = &this->m_fallback;
  _Var1 = *(__index_type *)
           ((long)&(this->m_fallback).
                   super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                   .
                   super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                   .
                   super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                   .
                   super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                   .
                   super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                   .
                   super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
           + 0x58);
  if (_Var1 == '\x02') {
    pvVar2 = std::get<2ul,RPCArg::Optional,std::__cxx11::string,UniValue>(__v);
    UniValue::write_abi_cxx11_((UniValue *)&bStack_68,(int)pvVar2,(void *)0x0,0);
    std::operator+(&local_48,", optional, default=",&bStack_68);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    if (_Var1 != '\x01') {
      pvVar3 = std::get<0ul,RPCArg::Optional,std::__cxx11::string,UniValue>(__v);
      if (*pvVar3 == NO) {
        __s = ", required";
      }
      else {
        if ((*pvVar3 != OMITTED) || (!is_named_arg)) goto LAB_005ba823;
        __s = ", optional";
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,__s);
      goto LAB_005ba823;
    }
    __rhs = std::get<1ul,RPCArg::Optional,std::__cxx11::string,UniValue>(__v);
    std::operator+(&local_48,", optional, default=",__rhs);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_48);
    this_00 = &local_48;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_005ba823:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,")");
  if (this->m_type == OBJ_NAMED_PARAMS) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,
               " Options object that can be used to pass named arguments, listed below.");
  }
  if ((this->m_description)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"",(allocator<char> *)&bStack_68);
  }
  else {
    std::operator+(&local_48," ",&this->m_description);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string RPCArg::ToDescriptionString(bool is_named_arg) const
{
    std::string ret;
    ret += "(";
    if (m_opts.type_str.size() != 0) {
        ret += m_opts.type_str.at(1);
    } else {
        switch (m_type) {
        case Type::STR_HEX:
        case Type::STR: {
            ret += "string";
            break;
        }
        case Type::NUM: {
            ret += "numeric";
            break;
        }
        case Type::AMOUNT: {
            ret += "numeric or string";
            break;
        }
        case Type::RANGE: {
            ret += "numeric or array";
            break;
        }
        case Type::BOOL: {
            ret += "boolean";
            break;
        }
        case Type::OBJ:
        case Type::OBJ_NAMED_PARAMS:
        case Type::OBJ_USER_KEYS: {
            ret += "json object";
            break;
        }
        case Type::ARR: {
            ret += "json array";
            break;
        }
        } // no default case, so the compiler can warn about missing cases
    }
    if (m_fallback.index() == 1) {
        ret += ", optional, default=" + std::get<RPCArg::DefaultHint>(m_fallback);
    } else if (m_fallback.index() == 2) {
        ret += ", optional, default=" + std::get<RPCArg::Default>(m_fallback).write();
    } else {
        switch (std::get<RPCArg::Optional>(m_fallback)) {
        case RPCArg::Optional::OMITTED: {
            if (is_named_arg) ret += ", optional"; // Default value is "null" in dicts. Otherwise,
            // nothing to do. Element is treated as if not present and has no default value
            break;
        }
        case RPCArg::Optional::NO: {
            ret += ", required";
            break;
        }
        } // no default case, so the compiler can warn about missing cases
    }
    ret += ")";
    if (m_type == Type::OBJ_NAMED_PARAMS) ret += " Options object that can be used to pass named arguments, listed below.";
    ret += m_description.empty() ? "" : " " + m_description;
    return ret;
}